

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O1

int coda_ascbin_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  int64_t *piVar1;
  coda_expression *expr;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  char *pcVar7;
  coda_dynamic_type *pcVar8;
  long lVar9;
  coda_type *pcVar10;
  int64_t iVar11;
  int64_t field_bit_size;
  int64_t rel_bit_offset;
  int available;
  coda_cursor field_cursor;
  int64_t local_368;
  long local_360;
  long local_358;
  int local_34c;
  anon_struct_24_3_5e6533e2 *local_348;
  coda_cursor local_340;
  
  pcVar10 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar10->format) {
    pcVar10 = *(coda_type **)&pcVar10->type_class;
  }
  lVar6 = pcVar10->bit_size;
  if (-1 < lVar6) {
LAB_00119c33:
    *bit_size = lVar6;
    return 0;
  }
  if (pcVar10->type_class == 1) {
    iVar4 = coda_cursor_get_num_elements(cursor,&local_358);
    if (iVar4 != 0) {
      return -1;
    }
    if (local_358 == 0) {
      lVar6 = 0;
    }
    else {
      if ((*(coda_type **)(pcVar10 + 1))->bit_size < 0) {
        memcpy(&local_340,cursor,0x310);
        lVar6 = (long)local_340.n;
        local_340.n = local_340.n + 1;
        local_340.stack[lVar6].bit_offset = local_340.stack[lVar6 + -1].bit_offset;
        bVar3 = 0 < local_358;
        if (local_358 < 1) {
          iVar11 = 0;
        }
        else {
          lVar6 = 0;
          iVar11 = 0;
          do {
            lVar9 = (long)local_340.n;
            local_340.stack[lVar9 + -1].type =
                 (coda_dynamic_type_struct *)*(coda_type **)(pcVar10 + 1);
            local_340.stack[lVar9 + -1].index = lVar6;
            iVar4 = coda_cursor_get_bit_size(&local_340,&local_368);
            if (iVar4 != 0) goto LAB_00119f9d;
            iVar11 = iVar11 + local_368;
            piVar1 = &local_340.stack[(long)local_340.n + -1].bit_offset;
            *piVar1 = *piVar1 + local_368;
            lVar6 = lVar6 + 1;
            bVar3 = lVar6 < local_358;
          } while (lVar6 < local_358);
        }
        *bit_size = iVar11;
LAB_00119f9d:
        if (bVar3) {
          return -1;
        }
        return 0;
      }
      lVar6 = (*(coda_type **)(pcVar10 + 1))->bit_size * local_358;
    }
    goto LAB_00119c33;
  }
  if (pcVar10->type_class != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                  ,0x300,"int coda_ascbin_cursor_get_bit_size(const coda_cursor *, int64_t *)");
  }
  piVar5 = (int *)__tls_get_addr(&PTR_001e0d40);
  if ((*piVar5 != 0) && (pcVar10->size_expr != (coda_expression *)0x0)) {
    iVar4 = coda_expression_eval_integer(pcVar10->size_expr,cursor,bit_size);
    if (iVar4 == 0) {
      if (pcVar10->bit_size == -8) {
        *bit_size = *bit_size << 3;
      }
      if (-1 < *bit_size) {
        return 0;
      }
      coda_set_error(-300,"calculated size is negative (%ld bits)");
    }
    else {
      coda_add_error_message(" for size expression");
    }
    coda_cursor_add_to_error_message(cursor);
    return -1;
  }
  if (pcVar10[1].attributes != (coda_type_record *)0x0) {
    memcpy(&local_340,cursor,0x310);
    iVar4 = coda_cursor_goto_available_union_field(&local_340);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = coda_cursor_get_bit_size(&local_340,bit_size);
    if (iVar4 == 0) {
      return 0;
    }
    return -1;
  }
  if ((long)pcVar10[1].name < 1) {
    local_360 = 0;
    goto LAB_00119e5c;
  }
  memcpy(&local_340,cursor,0x310);
  iVar4 = coda_cursor_goto_first_record_field(&local_340);
  if (iVar4 == 0) {
    pcVar7 = pcVar10[1].name;
    if ((long)pcVar7 < 1) {
      bVar3 = true;
      goto LAB_00119d45;
    }
    local_348 = cursor->stack;
    local_360 = 0;
    lVar6 = 1;
    do {
      local_368 = -1;
      if (((lVar6 + -1 < (long)(pcVar7 + -1)) &&
          (iVar4 = get_next_relative_field_bit_offset(&local_340,&local_358,&local_368), iVar4 != 0)
          ) || ((local_368 < 0 &&
                (iVar4 = coda_cursor_get_bit_size(&local_340,&local_368), iVar4 != 0)))) {
LAB_00119f2b:
        bVar3 = false;
      }
      else {
        local_360 = local_360 + local_368;
        bVar3 = true;
        if (lVar6 + -1 < (long)(pcVar10[1].name + -1)) {
          local_34c = 1;
          expr = *(coda_expression **)(*(long *)(pcVar10[1].description + lVar6 * 8) + 0x20);
          if ((expr != (coda_expression *)0x0) &&
             (iVar4 = coda_expression_eval_bool(expr,cursor,&local_34c), iVar4 != 0))
          goto LAB_00119f2b;
          if (local_34c == 0) {
            pcVar8 = coda_no_data_singleton(pcVar10->format);
          }
          else {
            pcVar8 = *(coda_dynamic_type **)(*(long *)(pcVar10[1].description + lVar6 * 8) + 0x10);
          }
          local_340.stack[(long)local_340.n + -1].type = pcVar8;
          lVar9 = (long)local_340.n;
          local_340.stack[lVar9 + -1].index = lVar6;
          local_340.stack[lVar9 + -1].bit_offset =
               local_358 + local_348[(long)cursor->n + -1].bit_offset;
        }
      }
      if (!bVar3) break;
      pcVar7 = pcVar10[1].name;
      bVar2 = lVar6 < (long)pcVar7;
      lVar6 = lVar6 + 1;
    } while (bVar2);
  }
  else {
    bVar3 = false;
LAB_00119d45:
    local_360 = 0;
  }
  if (!bVar3) {
    return -1;
  }
LAB_00119e5c:
  *bit_size = local_360;
  return 0;
}

Assistant:

int coda_ascbin_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->bit_size >= 0)
    {
        *bit_size = type->bit_size;
    }
    else
    {
        switch (type->type_class)
        {
            case coda_record_class:
                {
                    coda_type_record *record = (coda_type_record *)type;

                    if (coda_option_use_fast_size_expressions && record->size_expr != NULL)
                    {
                        if (coda_expression_eval_integer(record->size_expr, cursor, bit_size) != 0)
                        {
                            coda_add_error_message(" for size expression");
                            coda_cursor_add_to_error_message(cursor);
                            return -1;
                        }
                        if (record->bit_size == -8)
                        {
                            /* convert 'byte size' to 'bit size' */
                            *bit_size *= 8;
                        }
                        if (*bit_size < 0)
                        {
                            coda_set_error(CODA_ERROR_PRODUCT, "calculated size is negative (%ld bits)",
                                           (long)*bit_size);
                            coda_cursor_add_to_error_message(cursor);
                            return -1;
                        }
                    }
                    else if (record->union_field_expr != NULL)
                    {
                        coda_cursor field_cursor;

                        field_cursor = *cursor;
                        if (coda_cursor_goto_available_union_field(&field_cursor) != 0)
                        {
                            return -1;
                        }
                        if (coda_cursor_get_bit_size(&field_cursor, bit_size) != 0)
                        {
                            return -1;
                        }
                    }
                    else
                    {
                        int64_t record_bit_size;

                        record_bit_size = 0;
                        if (record->num_fields > 0)
                        {
                            coda_cursor field_cursor;
                            long i;

                            field_cursor = *cursor;
                            if (coda_cursor_goto_first_record_field(&field_cursor) != 0)
                            {
                                return -1;
                            }
                            for (i = 0; i < record->num_fields; i++)
                            {
                                int64_t rel_bit_offset;
                                int64_t field_bit_size;

                                field_bit_size = -1;
                                if (i < record->num_fields - 1)
                                {
                                    if (get_next_relative_field_bit_offset(&field_cursor, &rel_bit_offset,
                                                                           &field_bit_size) != 0)
                                    {
                                        return -1;
                                    }
                                }
                                if (field_bit_size < 0)
                                {
                                    if (coda_cursor_get_bit_size(&field_cursor, &field_bit_size) != 0)
                                    {
                                        return -1;
                                    }
                                }
                                record_bit_size += field_bit_size;
                                if (i < record->num_fields - 1)
                                {
                                    int available = 1;

                                    if (record->field[i + 1]->available_expr != NULL)
                                    {
                                        if (coda_expression_eval_bool(record->field[i + 1]->available_expr, cursor,
                                                                      &available) != 0)
                                        {
                                            return -1;
                                        }
                                    }
                                    if (available)
                                    {
                                        field_cursor.stack[field_cursor.n - 1].type =
                                            (coda_dynamic_type *)record->field[i + 1]->type;
                                    }
                                    else
                                    {
                                        field_cursor.stack[field_cursor.n - 1].type =
                                            coda_no_data_singleton(record->format);
                                    }
                                    field_cursor.stack[field_cursor.n - 1].index = i + 1;
                                    field_cursor.stack[field_cursor.n - 1].bit_offset =
                                        cursor->stack[cursor->n - 1].bit_offset + rel_bit_offset;
                                }
                            }
                        }
                        *bit_size = record_bit_size;
                    }
                }
                break;
            case coda_array_class:
                {
                    coda_type_array *array = (coda_type_array *)type;
                    long num_elements;

                    /* get the number of elements in array */
                    if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
                    {
                        return -1;
                    }

                    if (num_elements == 0)
                    {
                        /* empty array */
                        *bit_size = 0;
                    }
                    else if (array->base_type->bit_size >= 0)
                    {
                        /* the basetype has a constant size. */
                        *bit_size = num_elements * array->base_type->bit_size;
                    }
                    else
                    {
                        coda_cursor array_cursor;
                        int64_t array_bit_size;
                        long i;

                        /* sum the sizes of the elements 'manually' */
                        array_bit_size = 0;
                        array_cursor = *cursor;
                        array_cursor.n++;
                        array_cursor.stack[array_cursor.n - 1].bit_offset =
                            array_cursor.stack[array_cursor.n - 2].bit_offset;
                        for (i = 0; i < num_elements; i++)
                        {
                            int64_t element_bit_size;

                            array_cursor.stack[array_cursor.n - 1].type = (coda_dynamic_type *)array->base_type;
                            array_cursor.stack[array_cursor.n - 1].index = i;
                            if (coda_cursor_get_bit_size(&array_cursor, &element_bit_size) != 0)
                            {
                                return -1;
                            }
                            array_bit_size += element_bit_size;
                            array_cursor.stack[array_cursor.n - 1].bit_offset += element_bit_size;
                        }
                        *bit_size = array_bit_size;
                    }
                }
                break;
            default:
                assert(0);
                exit(1);
        }
    }

    return 0;
}